

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::EachValue<Js::SourceTextModuleRecord::ConfirmChildrenParsed()::__0>
          (BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,anon_class_8_1_6971b95b fn)

{
  SourceTextModuleRecord **ppSVar1;
  int local_20;
  uint local_1c;
  int currentIndex;
  uint i;
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  anon_class_8_1_6971b95b fn_local;
  
  this_local = (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)fn.result;
  for (local_1c = 0; local_1c < *(uint *)(this + 0x1c); local_1c = local_1c + 1) {
    if (*(int *)(*(long *)this + (ulong)local_1c * 4) != -1) {
      for (local_20 = *(int *)(*(long *)this + (ulong)local_1c * 4); local_20 != -1;
          local_20 = *(int *)(*(long *)(this + 8) + (long)local_20 * 0x18 + 8)) {
        ppSVar1 = anon_unknown_4::
                  ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                  ::Value((ValueEntry<Js::SourceTextModuleRecord_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<const_char16_t_*,_Js::SourceTextModuleRecord_*>_>
                           *)(*(long *)(this + 8) + (long)local_20 * 0x18));
        Js::SourceTextModuleRecord::ConfirmChildrenParsed::anon_class_8_1_6971b95b::operator()
                  ((anon_class_8_1_6971b95b *)&this_local,*ppSVar1);
      }
    }
  }
  return;
}

Assistant:

void EachValue(Fn fn) const
        {
            for (uint i = 0; i < bucketCount; i++)
            {
                if(buckets[i] != -1)
                {
                    for (int currentIndex = buckets[i] ; currentIndex != -1 ; currentIndex = entries[currentIndex].next)
                    {
                        fn(entries[currentIndex].Value());
                    }
                }
            }
        }